

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

void slang::ast::DefParamSymbol::fromSyntax
               (Scope *scope,DefParamSyntax *syntax,
               SmallVectorBase<const_slang::ast::DefParamSymbol_*> *results)

{
  Compilation *this;
  SyntaxNode *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  DefParamSymbol *this_01;
  ulong uVar2;
  long lVar3;
  DefParamSymbol *sym;
  Token local_48;
  SourceLocation local_38;
  
  uVar2 = (syntax->assignments).elements._M_extent._M_extent_value + 1;
  if (1 < uVar2) {
    this = scope->compilation;
    uVar2 = uVar2 >> 1;
    lVar3 = 0;
    do {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->assignments).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar3));
      this_00 = *ppSVar1;
      local_48 = slang::syntax::SyntaxNode::getFirstToken(this_00);
      local_38 = parsing::Token::location(&local_48);
      this_01 = BumpAllocator::emplace<slang::ast::DefParamSymbol,slang::SourceLocation>
                          (&this->super_BumpAllocator,&local_38);
      local_48._0_8_ = this_01;
      (this_01->super_Symbol).originatingSyntax = this_00;
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&this_01->super_Symbol,scope,syntax_00);
      SmallVectorBase<slang::ast::DefParamSymbol_const*>::
      emplace_back<slang::ast::DefParamSymbol_const*const&>
                ((SmallVectorBase<slang::ast::DefParamSymbol_const*> *)results,
                 (DefParamSymbol **)&local_48);
      lVar3 = lVar3 + 0x30;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void DefParamSymbol::fromSyntax(const Scope& scope, const DefParamSyntax& syntax,
                                SmallVectorBase<const DefParamSymbol*>& results) {
    auto& comp = scope.getCompilation();
    for (auto assignment : syntax.assignments) {
        auto sym = comp.emplace<DefParamSymbol>(assignment->getFirstToken().location());
        sym->setSyntax(*assignment);
        sym->setAttributes(scope, syntax.attributes);
        results.push_back(sym);
    }
}